

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_consttex.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  EVP_PKEY_CTX *in_RDI;
  Spectrum res;
  double resCol [3];
  Spectrum green;
  double greenCol [3];
  Spectrum red;
  double redCol [3];
  SpectrumType in_stack_0000342c;
  double *in_stack_00003430;
  CoefficientSpectrum<60> *in_stack_fffffffffffff818;
  SampledSpectrum *in_stack_fffffffffffff820;
  double *in_stack_fffffffffffff828;
  SampledSpectrum *in_stack_fffffffffffff830;
  CoefficientSpectrum<60> *in_stack_fffffffffffff838;
  CoefficientSpectrum<60> *in_stack_fffffffffffff840;
  double local_428;
  double local_420;
  double local_418;
  
  phyr::SampledSpectrum::init(in_RDI);
  phyr::SampledSpectrum::getFromRGB(in_stack_00003430,in_stack_0000342c);
  phyr::SampledSpectrum::getFromRGB(in_stack_00003430,in_stack_0000342c);
  phyr::CoefficientSpectrum<60>::operator*(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  phyr::SampledSpectrum::SampledSpectrum(in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  phyr::SampledSpectrum::toRGBConstants(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
  poVar1 = std::operator<<((ostream *)&std::cout,"R: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_428);
  poVar1 = std::operator<<(poVar1,", G: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_420);
  poVar1 = std::operator<<(poVar1,", B: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_418);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
    using namespace phyr;

    // Initiate Spectrum data
    Spectrum::init();

    // Create a red Spectrum
    Real redCol[3] = { 1, 0, 0 };
    Spectrum red = Spectrum::getFromRGB(redCol, SpectrumType::Reflectance);

    Real greenCol[3] = { 0, 1, 0 };
    Spectrum green = Spectrum::getFromRGB(greenCol, SpectrumType::Reflectance);

    Real resCol[3];
    Spectrum res = red * green;
    res.toRGBConstants(resCol);

    std::cout << "R: " << resCol[0] << ", G: " << resCol[1] << ", B: " << resCol[2] <<  std::endl;
    return 0;
}